

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O1

TProb<double> * __thiscall
libDAI::TProb<double>::sgn(TProb<double> *__return_storage_ptr__,TProb<double> *this)

{
  iterator __position;
  pointer pdVar1;
  ulong uVar2;
  double s;
  double local_38;
  
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (&__return_storage_ptr__->_p,
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish != pdVar1) {
    uVar2 = 0;
    do {
      local_38 = 0.0;
      if (pdVar1[uVar2] <= 0.0) {
        if (pdVar1[uVar2] < 0.0) {
          local_38 = -1.0;
        }
      }
      else {
        local_38 = 1.0;
      }
      __position._M_current =
           (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_38);
      }
      else {
        *__position._M_current = local_38;
        (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = uVar2 + 1;
      pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

TProb<T> sgn() const {
                TProb<T> x;
                x._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ ) {
                    T s = 0;
                    if( _p[i] > 0 )
                        s = 1;
                    else if( _p[i] < 0 )
                        s = -1;
                    x._p.push_back( s );
                }
                return x;
            }